

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O3

Gia_Man_t * Gia_ManRetimeForwardOne(Gia_Man_t *p,int *pnRegFixed,int *pnRegMoves)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  Vec_Ptr_t *vCut;
  void **ppvVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  Gia_Obj_t *pGVar16;
  Gia_Obj_t *pGVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  ulong local_50;
  Vec_Int_t *local_40;
  ulong local_38;
  
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    p_00 = (Vec_Int_t *)0x0;
    local_40 = (Vec_Int_t *)0x0;
  }
  else {
    iVar11 = p->nObjs;
    p_00 = (Vec_Int_t *)malloc(0x10);
    iVar8 = 0x10;
    if (0xe < iVar11 - 1U) {
      iVar8 = iVar11;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar8;
    if (iVar8 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)iVar8 << 2);
    }
    p_00->pArray = piVar3;
    if (0 < iVar11) {
      iVar11 = 0;
      do {
        Vec_IntPush(p_00,-1);
        iVar11 = iVar11 + 1;
      } while (iVar11 < p->nObjs);
    }
    uVar13 = p->nRegs;
    uVar10 = (ulong)uVar13;
    if (0 < (int)uVar13) {
      pVVar1 = p->vCis;
      lVar9 = 0;
      do {
        iVar11 = pVVar1->nSize;
        uVar13 = (uint)uVar10;
        uVar10 = (ulong)(iVar11 - uVar13) + lVar9;
        iVar8 = (int)uVar10;
        if ((iVar8 < 0) || (iVar11 <= iVar8)) goto LAB_007b47b3;
        iVar11 = pVVar1->pArray[uVar10 & 0xffffffff];
        if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_007b4794;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (p->vFlopClasses->nSize <= lVar9) goto LAB_007b47b3;
        if (p_00->nSize <= iVar11) goto LAB_007b484e;
        p_00->pArray[iVar11] = p->vFlopClasses->pArray[lVar9];
        lVar9 = lVar9 + 1;
        uVar13 = p->nRegs;
        uVar10 = (ulong)(int)uVar13;
      } while (lVar9 < (long)uVar10);
    }
    local_40 = (Vec_Int_t *)malloc(0x10);
    uVar12 = 0x10;
    if (0xe < uVar13 - 1) {
      uVar12 = uVar13;
    }
    local_40->nSize = 0;
    local_40->nCap = uVar12;
    if (uVar12 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)(int)uVar12 << 2);
    }
    local_40->pArray = piVar3;
  }
  Gia_ManIncrementTravId(p);
  Gia_ManMarkAutonomous(p);
  Gia_ManIncrementTravId(p);
  *pnRegFixed = 0;
  iVar11 = p->nRegs;
  if (0 < iVar11) {
    pVVar1 = p->vCis;
    iVar8 = 0;
    do {
      iVar14 = pVVar1->nSize;
      uVar13 = (iVar14 - iVar11) + iVar8;
      if (((int)uVar13 < 0) || (iVar14 <= (int)uVar13)) goto LAB_007b47b3;
      iVar11 = pVVar1->pArray[uVar13];
      lVar9 = (long)iVar11;
      if ((lVar9 < 0) || (p->nObjs <= iVar11)) goto LAB_007b4794;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar11) goto LAB_007b47f1;
      if (p->pTravIds[lVar9] == p->nTravIds + -1) {
        p->pTravIds[lVar9] = p->nTravIds;
      }
      else {
        *pnRegFixed = *pnRegFixed + 1;
      }
      iVar8 = iVar8 + 1;
      iVar11 = p->nRegs;
    } while (iVar8 < iVar11);
  }
  *pnRegMoves = 0;
  uVar13 = p->nObjs;
  if ((0 < (int)uVar13) && (pGVar6 = p->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    lVar9 = 0;
    uVar10 = 0;
    pGVar4 = pGVar6;
    do {
      uVar15 = *(ulong *)pGVar4;
      if ((uVar15 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar15) {
        iVar11 = (int)(uVar15 & 0x1fffffff);
        pGVar17 = (Gia_Obj_t *)((long)pGVar4 + (ulong)(uint)(iVar11 * 4) * -3);
        if ((pGVar17 < pGVar6) || (pGVar6 + uVar13 <= pGVar17)) goto LAB_007b47d2;
        iVar11 = (int)((long)(lVar9 + (ulong)(uint)(iVar11 << 2) * -3) >> 2) * -0x55555555;
        if (p->nTravIdsAlloc <= iVar11) {
LAB_007b482f:
          __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
        }
        piVar3 = p->pTravIds;
        if (piVar3[iVar11] == p->nTravIds) {
          uVar12 = (uint)(uVar15 >> 0x20);
          uVar19 = uVar12 & 0x1fffffff;
          pGVar17 = (Gia_Obj_t *)((long)pGVar4 + (ulong)(uVar19 * 4) * -3);
          if ((pGVar17 < pGVar6) || (pGVar6 + uVar13 <= pGVar17)) goto LAB_007b47d2;
          iVar8 = (int)((long)(lVar9 + (ulong)(uVar19 << 2) * -3) >> 2) * -0x55555555;
          if (p->nTravIdsAlloc <= iVar8) goto LAB_007b482f;
          if (piVar3[iVar8] == piVar3[iVar11]) {
            if (p_00 != (Vec_Int_t *)0x0) {
              uVar15 = -((uint)uVar15 & 0x1fffffff) + uVar10;
              iVar11 = (int)uVar15;
              if (iVar11 < 0) goto LAB_007b47b3;
              uVar19 = p_00->nSize;
              if ((int)uVar19 <= iVar11) goto LAB_007b47b3;
              uVar18 = -(uVar12 & 0x1fffffff) + uVar10;
              uVar12 = (uint)uVar18;
              if (((int)uVar12 < 0) || (uVar19 <= uVar12)) goto LAB_007b47b3;
              piVar2 = p_00->pArray;
              if (piVar2[uVar15 & 0xffffffff] != piVar2[uVar18 & 0xffffffff]) goto LAB_007b4165;
              if (uVar19 <= uVar10) {
LAB_007b484e:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              piVar2[uVar10] = piVar2[uVar15 & 0xffffffff];
              uVar13 = p->nObjs;
            }
            if ((long)(int)uVar13 <= (long)uVar10) goto LAB_007b47d2;
            if ((long)p->nTravIdsAlloc <= (long)uVar10) goto LAB_007b4810;
            piVar3[uVar10] = p->nTravIds;
            *pnRegMoves = *pnRegMoves + 1;
            uVar13 = p->nObjs;
          }
        }
      }
LAB_007b4165:
      uVar10 = uVar10 + 1;
      pGVar4 = pGVar4 + 1;
      lVar9 = lVar9 + 0xc;
    } while ((long)uVar10 < (long)(int)uVar13);
  }
  iVar11 = p->nRegs;
  if (0 < iVar11) {
    pVVar1 = p->vCis;
    iVar8 = 0;
    do {
      iVar14 = pVVar1->nSize;
      uVar13 = (iVar14 - iVar11) + iVar8;
      if (((int)uVar13 < 0) || (iVar14 <= (int)uVar13)) goto LAB_007b47b3;
      iVar11 = pVVar1->pArray[uVar13];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) {
LAB_007b4794:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar11) goto LAB_007b4810;
      p->pTravIds[iVar11] = p->nTravIds;
      iVar8 = iVar8 + 1;
      iVar11 = p->nRegs;
    } while (iVar8 < iVar11);
  }
  vCut = (Vec_Ptr_t *)malloc(0x10);
  vCut->nCap = 1000;
  vCut->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  vCut->pArray = ppvVar5;
  Gia_ManIncrementTravId(p);
  uVar10 = (ulong)(uint)p->nObjs;
  if (p->nObjs < 1) {
    iVar11 = 0;
  }
  else {
    pGVar6 = p->pObjs;
    lVar9 = 0;
    local_50 = 1000;
    local_38 = 1000;
    iVar11 = 0;
    lVar20 = 0;
    pGVar4 = pGVar6;
    do {
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= lVar20) goto LAB_007b47f1;
      piVar3 = p->pTravIds;
      iVar8 = p->nTravIds;
      pGVar17 = pGVar4;
      if (piVar3[lVar20] != iVar8 + -1) {
        uVar15 = *(ulong *)(&pGVar4->field_0x0 + lVar9);
        uVar18 = uVar15 & 0x1fffffff;
        if (uVar18 != 0x1fffffff) {
          pGVar16 = (Gia_Obj_t *)((long)pGVar4 + lVar9 + (ulong)(uint)((int)uVar18 * 4) * -3);
          if ((pGVar16 < pGVar4) || (pGVar4 + (uVar10 & 0xffffffff) <= pGVar16)) {
LAB_007b47d2:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar14 = (int)((long)(lVar9 + (ulong)(uint)((int)uVar18 * 4) * -3) >> 2) * -0x55555555;
          if (p->nTravIdsAlloc <= iVar14) {
LAB_007b47f1:
            __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x265,"int Gia_ObjIsTravIdPrevious(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (piVar3[iVar14] == iVar8 + -1) {
            if (local_40 != (Vec_Int_t *)0x0) {
              uVar10 = (ulong)-((uint)uVar15 & 0x1fffffff) + lVar20;
              iVar8 = (int)uVar10;
              if ((iVar8 < 0) || (p_00->nSize <= iVar8)) {
LAB_007b47b3:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              Vec_IntPush(local_40,p_00->pArray[uVar10 & 0xffffffff]);
              uVar18 = (ulong)((uint)*(undefined8 *)(&pGVar4->field_0x0 + lVar9) & 0x1fffffff);
            }
            iVar8 = (int)local_38;
            if (iVar11 == iVar8) {
              if (iVar8 < 0x10) {
                if (vCut->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(vCut->pArray,0x80);
                }
                vCut->pArray = ppvVar5;
                vCut->nCap = 0x10;
                local_50 = 0x10;
                local_38 = 0x10;
              }
              else {
                uVar13 = iVar8 * 2;
                local_38 = (ulong)uVar13;
                if (vCut->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(local_38 * 8);
                }
                else {
                  ppvVar5 = (void **)realloc(vCut->pArray,local_38 * 8);
                }
                vCut->pArray = ppvVar5;
                vCut->nCap = uVar13;
                local_50 = (ulong)uVar13;
              }
            }
            else {
              ppvVar5 = vCut->pArray;
            }
            vCut->nSize = iVar11 + 1;
            ppvVar5[iVar11] = &pGVar4[-uVar18].field_0x0 + lVar9;
            uVar13 = (uint)*(undefined8 *)(&pGVar4->field_0x0 + lVar9) & 0x1fffffff;
            pGVar17 = (Gia_Obj_t *)((long)pGVar4 + (ulong)(uVar13 * 4) * -3 + lVar9);
            pGVar6 = p->pObjs;
            if ((pGVar17 < pGVar6) || (pGVar6 + p->nObjs <= pGVar17)) goto LAB_007b47d2;
            iVar14 = (int)((long)((long)pGVar4 + lVar9 + ((ulong)(uVar13 << 2) * -3 - (long)pGVar6))
                          >> 2) * -0x55555555;
            if (p->nTravIdsAlloc <= iVar14) {
LAB_007b4810:
              __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar8 = p->nTravIds;
            piVar3 = p->pTravIds;
            piVar3[iVar14] = iVar8;
            uVar15 = *(ulong *)(&pGVar4->field_0x0 + lVar9);
            uVar18 = (ulong)((uint)uVar15 & 0x1fffffff);
            pGVar17 = pGVar6;
            iVar11 = iVar11 + 1;
          }
          if ((-1 < (int)uVar15) && ((int)uVar18 != 0x1fffffff)) {
            uVar13 = (uint)(uVar15 >> 0x20);
            uVar12 = uVar13 & 0x1fffffff;
            pGVar17 = (Gia_Obj_t *)((long)pGVar4 + lVar9 + (ulong)(uVar12 * 4) * -3);
            if ((pGVar17 < pGVar6) || (pGVar6 + p->nObjs <= pGVar17)) goto LAB_007b47d2;
            iVar14 = (int)((long)((long)pGVar4 + lVar9 + ((ulong)(uVar12 * 4) * -3 - (long)pGVar6))
                          >> 2) * -0x55555555;
            if (p->nTravIdsAlloc <= iVar14) goto LAB_007b47f1;
            pGVar17 = pGVar6;
            if (piVar3[iVar14] == iVar8 + -1) {
              if (local_40 != (Vec_Int_t *)0x0) {
                uVar10 = (ulong)-(uVar13 & 0x1fffffff) + lVar20;
                iVar8 = (int)uVar10;
                if ((iVar8 < 0) || (p_00->nSize <= iVar8)) goto LAB_007b47b3;
                Vec_IntPush(local_40,p_00->pArray[uVar10 & 0xffffffff]);
                uVar12 = *(uint *)(&pGVar4->field_0x4 + lVar9) & 0x1fffffff;
              }
              iVar8 = (int)local_50;
              if (iVar11 == iVar8) {
                if (iVar8 < 0x10) {
                  if (vCut->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vCut->pArray,0x80);
                  }
                  vCut->pArray = ppvVar5;
                  vCut->nCap = 0x10;
                  local_50 = 0x10;
                }
                else {
                  local_50 = (ulong)(uint)(iVar8 * 2);
                  if (vCut->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(local_50 * 8);
                  }
                  else {
                    ppvVar5 = (void **)realloc(vCut->pArray,local_50 * 8);
                  }
                  vCut->pArray = ppvVar5;
                  vCut->nCap = iVar8 * 2;
                }
              }
              else {
                ppvVar5 = vCut->pArray;
              }
              vCut->nSize = iVar11 + 1;
              ppvVar5[iVar11] = &pGVar4[-(ulong)uVar12].field_0x0 + lVar9;
              uVar13 = *(uint *)(&pGVar4->field_0x4 + lVar9) & 0x1fffffff;
              pGVar17 = (Gia_Obj_t *)((long)pGVar4 + (ulong)(uVar13 * 4) * -3 + lVar9);
              pGVar6 = p->pObjs;
              if ((pGVar17 < pGVar6) || (pGVar6 + p->nObjs <= pGVar17)) goto LAB_007b47d2;
              iVar8 = (int)((long)((long)pGVar4 + lVar9 + ((ulong)(uVar13 << 2) * -3 - (long)pGVar6)
                                  ) >> 2) * -0x55555555;
              if (p->nTravIdsAlloc <= iVar8) goto LAB_007b4810;
              p->pTravIds[iVar8] = p->nTravIds;
              local_38 = local_50;
              pGVar17 = pGVar6;
              iVar11 = iVar11 + 1;
            }
          }
        }
      }
      lVar20 = lVar20 + 1;
      uVar10 = (ulong)p->nObjs;
      lVar9 = lVar9 + 0xc;
      pGVar4 = pGVar17;
    } while (lVar20 < (long)uVar10);
  }
  if ((local_40 != (Vec_Int_t *)0x0) && (local_40->nSize != iVar11)) {
    __assert_fail("vFlopClasses == NULL || Vec_IntSize(vFlopClasses) == Vec_PtrSize(vCut)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaRetime.c"
                  ,0xf6,"Gia_Man_t *Gia_ManRetimeForwardOne(Gia_Man_t *, int *, int *)");
  }
  pGVar7 = Gia_ManRetimeDupForward(p,vCut);
  if (vCut->pArray != (void **)0x0) {
    free(vCut->pArray);
  }
  free(vCut);
  if (p_00 != (Vec_Int_t *)0x0) {
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
  }
  pGVar7->vFlopClasses = local_40;
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManRetimeForwardOne( Gia_Man_t * p, int * pnRegFixed, int * pnRegMoves )
{
    Vec_Int_t * vFlopClasses = NULL;
    Vec_Int_t * vObjClasses = NULL;
    Gia_Man_t * pNew;
    Vec_Ptr_t * vCut;
    Gia_Obj_t * pObj;
    int i;
    if ( p->vFlopClasses )
    {
//        printf( "Performing retiming with register classes.\n" );
        vObjClasses = Vec_IntAlloc( Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Vec_IntPush( vObjClasses, -1 );
        Gia_ManForEachRo( p, pObj, i )
            Vec_IntWriteEntry( vObjClasses, Gia_ObjId(p, pObj), Vec_IntEntry(p->vFlopClasses, i) );
        vFlopClasses = Vec_IntAlloc( Gia_ManRegNum(p) );
    }
    // mark the retimable nodes
    Gia_ManIncrementTravId( p );
    Gia_ManMarkAutonomous( p );
    // mark the retimable registers with the fresh trav ID
    Gia_ManIncrementTravId( p );
    *pnRegFixed = 0;
    Gia_ManForEachRo( p, pObj, i )
        if ( Gia_ObjIsTravIdPrevious(p, pObj) )
            Gia_ObjSetTravIdCurrent(p, pObj);
        else
            (*pnRegFixed)++;
    // mark all the nodes that can be retimed forward
    *pnRegMoves = 0;
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pObj)) && Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pObj)) )
        {
            if ( vObjClasses && Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) != Vec_IntEntry(vObjClasses, Gia_ObjFaninId1(pObj, i)) )
                continue;
            if ( vObjClasses )
                Vec_IntWriteEntry( vObjClasses, Gia_ObjId(p, pObj), Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) );
            Gia_ObjSetTravIdCurrent(p, pObj);
            (*pnRegMoves)++;
        }
    // mark the remaining registers
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetTravIdCurrent(p, pObj);
    // find the cut (all such marked objects that fanout into unmarked nodes)
    vCut = Vec_PtrAlloc( 1000 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsTravIdPrevious(p, pObj) )
            continue;
        if ( (Gia_ObjIsCo(pObj) || Gia_ObjIsAnd(pObj)) && Gia_ObjIsTravIdPrevious(p, Gia_ObjFanin0(pObj)) )
        {
            if ( vFlopClasses )
                Vec_IntPush( vFlopClasses, Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) );
            Vec_PtrPush( vCut, Gia_ObjFanin0(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
        }
        if ( Gia_ObjIsAnd(pObj) && Gia_ObjIsTravIdPrevious(p, Gia_ObjFanin1(pObj)) )
        {
            if ( vFlopClasses )
                Vec_IntPush( vFlopClasses, Vec_IntEntry(vObjClasses, Gia_ObjFaninId1(pObj, i)) );
            Vec_PtrPush( vCut, Gia_ObjFanin1(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin1(pObj) );
        }
    }
    assert( vFlopClasses == NULL || Vec_IntSize(vFlopClasses) == Vec_PtrSize(vCut) );
    // finally derive the new manager
    pNew = Gia_ManRetimeDupForward( p, vCut );
    Vec_PtrFree( vCut );
    if ( vObjClasses )
    Vec_IntFree( vObjClasses );
    pNew->vFlopClasses = vFlopClasses;
    return pNew;
}